

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<char_const*>*,std::vector<boost::iterator_range<char_const*>,std::allocator<boost::iterator_range<char_const*>>>>,boost::iterators::random_access_traversal_tag>>,std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
          *lhs,char *op,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  char *op_local;
  iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
  *lhs_local;
  
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)op;
  rhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>,_true>
            (&local_58,
             (iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }